

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O3

optional_ptr<duckdb::SecretStorage,_true> __thiscall
duckdb::SecretManager::GetSecretStorage(SecretManager *this,string *name)

{
  int iVar1;
  iterator iVar2;
  SecretStorage *pSVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->manager_lock);
  if (iVar1 == 0) {
    iVar2 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->secret_storages)._M_h,name);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pSVar3 = (SecretStorage *)0x0;
    }
    else {
      pSVar3 = *(SecretStorage **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>_>,_true>
                       ._M_cur + 0x28);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->manager_lock);
    return (optional_ptr<duckdb::SecretStorage,_true>)pSVar3;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

optional_ptr<SecretStorage> SecretManager::GetSecretStorage(const string &name) {
	lock_guard<mutex> lock(manager_lock);

	auto lookup = secret_storages.find(name);
	if (lookup != secret_storages.end()) {
		return lookup->second.get();
	}

	return nullptr;
}